

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSimpleUpdater.cpp
# Opt level: O2

void QSimpleUpdater::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == checkingFinished && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == appcastDownloaded && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == downloadFinished && lVar3 == 0) {
      *puVar1 = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      checkingFinished((QSimpleUpdater *)_o,(QString *)_a[1]);
      return;
    case 1:
      appcastDownloaded((QSimpleUpdater *)_o,(QString *)_a[1],(QByteArray *)_a[2]);
      return;
    case 2:
      downloadFinished((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 3:
      checkForUpdates((QSimpleUpdater *)_o,(QString *)_a[1]);
      return;
    case 4:
      setDownloadDir((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 5:
      setModuleName((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 6:
      setNotifyOnUpdate((QSimpleUpdater *)_o,(QString *)_a[1],*_a[2]);
      return;
    case 7:
      setNotifyOnFinish((QSimpleUpdater *)_o,(QString *)_a[1],*_a[2]);
      return;
    case 8:
      setPlatformKey((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 9:
      setModuleVersion((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 10:
      setDownloaderEnabled((QSimpleUpdater *)_o,(QString *)_a[1],*_a[2]);
      return;
    case 0xb:
      setUserAgentString((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 0xc:
      setUseCustomAppcast((QSimpleUpdater *)_o,(QString *)_a[1],*_a[2]);
      return;
    case 0xd:
      setUseCustomInstallProcedures((QSimpleUpdater *)_o,(QString *)_a[1],*_a[2]);
      return;
    case 0xe:
      setMandatoryUpdate((QSimpleUpdater *)_o,(QString *)_a[1],*_a[2]);
      return;
    case 0xf:
      setDownloadUserName((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 0x10:
      setDownloadPassword((QSimpleUpdater *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    }
  }
  return;
}

Assistant:

void QSimpleUpdater::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QSimpleUpdater *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->checkingFinished((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->appcastDownloaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2]))); break;
        case 2: _t->downloadFinished((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->checkForUpdates((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->setDownloadDir((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 5: _t->setModuleName((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 6: _t->setNotifyOnUpdate((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 7: _t->setNotifyOnFinish((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 8: _t->setPlatformKey((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 9: _t->setModuleVersion((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 10: _t->setDownloaderEnabled((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 11: _t->setUserAgentString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 12: _t->setUseCustomAppcast((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 13: _t->setUseCustomInstallProcedures((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 14: _t->setMandatoryUpdate((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 15: _t->setDownloadUserName((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 16: _t->setDownloadPassword((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QSimpleUpdater::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSimpleUpdater::checkingFinished)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QSimpleUpdater::*)(const QString & , const QByteArray & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSimpleUpdater::appcastDownloaded)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QSimpleUpdater::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSimpleUpdater::downloadFinished)) {
                *result = 2;
                return;
            }
        }
    }
}